

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O2

void save_keypress_history(keypress *kp)

{
  keypress *pkVar1;
  uint uVar2;
  keycode_t kVar3;
  keypress *__dest;
  char *pcVar4;
  short sVar5;
  ulong uVar6;
  
  if (*borg_cfg != 0) {
    if (kp->type == EVT_KBRD) {
      uVar2 = kp->code;
      uVar6 = (ulong)uVar2;
      if (uVar2 - 0x20 < 0x5f) {
        pcVar4 = format("& Key <%c> (0x%02lX)",uVar6,uVar6);
      }
      else {
        if (uVar6 == 0xe000) {
          pcVar4 = "& Key <Esc> (0x%02lX)";
          uVar6 = 0xe000;
        }
        else if (uVar2 == 0x9c) {
          pcVar4 = "& Key <Enter> (0x%02lX)";
          uVar6 = 0x9c;
        }
        else {
          pcVar4 = "& Key <0x%02lX>";
        }
        pcVar4 = format(pcVar4,uVar6);
      }
    }
    else {
      pcVar4 = format("& non-Keyboard <0x%02X>");
    }
    borg_note(pcVar4);
  }
  __dest = borg_key_history;
  sVar5 = borg_key_history_head + 1;
  kVar3 = kp->code;
  pkVar1 = borg_key_history + borg_key_history_head;
  borg_key_history_head = sVar5;
  pkVar1->type = kp->type;
  pkVar1->code = kVar3;
  if (sVar5 == 0x2000) {
    memcpy(__dest,__dest + 0x1f9b,0x4b0);
    borg_key_history_head = 100;
  }
  return;
}

Assistant:

void save_keypress_history(struct keypress *kp)
{
    /* Note the keypress */
    if (borg_cfg[BORG_VERBOSE]) {
        if (kp->type == EVT_KBRD) {
            keycode_t k = kp->code;
            if (k >= 32 && k <= 126) {
                borg_note(format("& Key <%c> (0x%02lX)", (char)k, (unsigned long)k));
            } else {
                if (k == KC_ENTER)
                    borg_note(format("& Key <Enter> (0x%02lX)", (unsigned long)k));
                else if (k == ESCAPE)
                    borg_note(format("& Key <Esc> (0x%02lX)", (unsigned long)k));
                else
                    borg_note(format("& Key <0x%02lX>", (unsigned long)k));
            }
        } else {
            borg_note(format("& non-Keyboard <0x%02X>", kp->type));
        }

    }

    /* Store the char, advance the queue */
    borg_key_history[borg_key_history_head].code = kp->code;
    borg_key_history[borg_key_history_head++].type = kp->type;

    /* on full array, keep the last 100 */
    if (borg_key_history_head == KEY_SIZE) {
        memcpy(borg_key_history, &borg_key_history[KEY_SIZE - 101], sizeof(struct keypress) * 100);
        borg_key_history_head = 100;
    }
}